

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O2

void cppassert::internal::BackTraceSymbol::findSymbolInBacktraceStr
               (char *backTraceSymbol,char **beginNamePtr,char **beginOffsetPtr,char **endOffsetPtr)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar2 = (char *)0x0;
  pcVar4 = (char *)0x0;
  do {
    cVar1 = *backTraceSymbol;
    pcVar3 = backTraceSymbol;
    pcVar5 = pcVar4;
    if ((cVar1 != '(') && (pcVar3 = pcVar2, pcVar5 = backTraceSymbol, cVar1 != '+')) {
      if (cVar1 == '\0') {
        backTraceSymbol = (char *)0x0;
LAB_00105b23:
        *beginNamePtr = pcVar2;
        *beginOffsetPtr = pcVar4;
        *endOffsetPtr = backTraceSymbol;
        return;
      }
      pcVar5 = pcVar4;
      if (cVar1 == ')' && pcVar4 != (char *)0x0) goto LAB_00105b23;
    }
    backTraceSymbol = backTraceSymbol + 1;
    pcVar2 = pcVar3;
    pcVar4 = pcVar5;
  } while( true );
}

Assistant:

static void findSymbolInBacktraceStr(
                char *backTraceSymbol
                , char **beginNamePtr
                , char **beginOffsetPtr
                , char **endOffsetPtr)
    {
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;

        for (char *position = backTraceSymbol; *position; ++position)
        {
            if (*position == '(')
            {
                beginName = position;
            }
            else if (*position == '+')
            {
                beginOffset = position;
            }
            else if (*position == ')' && beginOffset)
            {
                endOffset = position;
                break;
            }
        }
        *beginNamePtr = beginName;
        *beginOffsetPtr = beginOffset;
        *endOffsetPtr = endOffset;
    }